

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void triplet_to_planar(uint8_t *triplet_buffer,uint8_t *planar_buffer,size_t width,size_t height,
                      size_t stride)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  
  if (height != 0) {
    puVar2 = triplet_buffer + 2;
    lVar3 = 0;
    sVar4 = 0;
    do {
      puVar1 = puVar2;
      sVar5 = width;
      if (width != 0) {
        do {
          planar_buffer[lVar3] = puVar1[-2];
          planar_buffer[lVar3 + height * width] = puVar1[-1];
          planar_buffer[lVar3 + height * width * 2] = *puVar1;
          lVar3 = lVar3 + 1;
          puVar1 = puVar1 + 3;
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
      sVar4 = sVar4 + 1;
      puVar2 = puVar2 + stride;
    } while (sVar4 != height);
  }
  return;
}

Assistant:

static void triplet_to_planar(const uint8_t* triplet_buffer, uint8_t* planar_buffer, const size_t width, const size_t height,
                              const size_t stride)
{
    const size_t byte_count_plane = width * height;
    size_t plane_column = 0;

    for (size_t line = 0; line < height; ++line)
    {
        const size_t line_start = line * stride;
        for (size_t pixel = 0; pixel < width; ++pixel)
        {
            const size_t column = line_start + pixel * bytes_per_rgb_pixel;

            planar_buffer[plane_column] = triplet_buffer[column];
            planar_buffer[plane_column + 1 * byte_count_plane] = triplet_buffer[column + 1];
            planar_buffer[plane_column + 2 * byte_count_plane] = triplet_buffer[column + 2];
            ++plane_column;
        }
    }
}